

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

String __thiscall testing::internal::FlagToEnvVar(internal *this,char *flag)

{
  int iVar1;
  size_t sVar2;
  char *extraout_RAX;
  size_t extraout_RDX;
  ostream *poVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  long lVar5;
  String SVar6;
  String full_flag;
  char local_31;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  void *local_28;
  long local_20;
  
  Message::Message((Message *)&local_30);
  poVar3 = (ostream *)(local_30.ptr_ + 0x10);
  if (local_30.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar3 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"gtest_",6);
  if (flag == (char *)0x0) {
    sVar4.ptr_ = local_30.ptr_ + 0x10;
    sVar2 = 6;
    flag = "(null)";
  }
  else {
    sVar4.ptr_ = local_30.ptr_;
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_30.ptr_ + 0x10);
    }
    sVar2 = strlen(flag);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar4.ptr_,flag,sVar2);
  StringStreamToString((internal *)&local_28,local_30.ptr_);
  if (local_30.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
  }
  Message::Message((Message *)&local_30);
  if (local_20 != 0) {
    lVar5 = 0;
    do {
      iVar1 = toupper((uint)*(byte *)((long)local_28 + lVar5));
      poVar3 = (ostream *)(local_30.ptr_ + 0x10);
      if (local_30.ptr_ == (stringstream *)0x0) {
        poVar3 = (ostream *)0x0;
      }
      local_31 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_31,1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != local_20);
  }
  SVar6 = StringStreamToString(this,local_30.ptr_);
  if (local_30.ptr_ != (stringstream *)0x0) {
    SVar6 = (String)(**(code **)(*(long *)local_30.ptr_ + 8))();
  }
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
    SVar6.length_ = extraout_RDX;
    SVar6.c_str_ = extraout_RAX;
  }
  return SVar6;
}

Assistant:

static String FlagToEnvVar(const char* flag) {
  const String full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}